

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_19::BinaryReader::ReadF64(BinaryReader *this,uint64_t *out_value,char *desc)

{
  Offset *pOVar1;
  Offset OVar2;
  
  OVar2 = (this->state_).offset;
  if (this->read_end_ < OVar2 + 8) {
    PrintError(this,"unable to read %s: %s","double",desc);
    return (Result)Error;
  }
  *out_value = *(uint64_t *)((this->state_).data + OVar2);
  pOVar1 = &(this->state_).offset;
  *pOVar1 = *pOVar1 + 8;
  return (Result)Ok;
}

Assistant:

Result BinaryReader::ReadF64(uint64_t* out_value, const char* desc) {
  return ReadT(out_value, "double", desc);
}